

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O0

void __thiscall
cmInstalledFile::AppendProperty
          (cmInstalledFile *this,cmMakefile *mf,string *prop,string *value,bool param_4)

{
  cmake *cmakeInstance;
  element_type *this_00;
  string local_a8 [32];
  undefined1 local_88 [16];
  Property *property;
  undefined1 local_58 [8];
  cmGeneratorExpression ge;
  cmListFileBacktrace backtrace;
  bool param_4_local;
  string *value_local;
  string *prop_local;
  cmMakefile *mf_local;
  cmInstalledFile *this_local;
  
  cmMakefile::GetBacktrace
            ((cmMakefile *)
             &ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  cmakeInstance = cmMakefile::GetCMakeInstance(mf);
  cmListFileBacktrace::cmListFileBacktrace
            ((cmListFileBacktrace *)&property,
             (cmListFileBacktrace *)
             &ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_58,cmakeInstance,(cmListFileBacktrace *)&property);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&property);
  this_00 = (element_type *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
            ::operator[](&this->Properties,prop);
  local_88._8_8_ = this_00;
  std::__cxx11::string::string(local_a8,(string *)value);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_88,(string *)local_58);
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::push_back((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
               *)this_00,(value_type *)local_88);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)local_88);
  std::__cxx11::string::~string(local_a8);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_58);
  cmListFileBacktrace::~cmListFileBacktrace
            ((cmListFileBacktrace *)
             &ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void cmInstalledFile::AppendProperty(cmMakefile const* mf,
                                     const std::string& prop,
                                     const std::string& value,
                                     bool /*asString*/)
{
  cmListFileBacktrace backtrace = mf->GetBacktrace();
  cmGeneratorExpression ge(*mf->GetCMakeInstance(), backtrace);

  Property& property = this->Properties[prop];
  property.ValueExpressions.push_back(ge.Parse(value));
}